

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

void * __thiscall
embree::sse2::GeneralBVHBuilder::
BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_void_*,_embree::FastAllocator::CachedAllocator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:291:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:296:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:306:9),_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:312:9)>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:322:9)>
::recurse(BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:317:9),_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_void_*,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:291:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:296:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:306:9),_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:312:9)>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:322:9)>
          *this,BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
                *current,CachedAllocator alloc,bool toplevel)

{
  PrimInfoExtRange *set;
  __int_type_conflict _Var1;
  size_t sVar2;
  byte bVar3;
  BVH *pBVar4;
  anon_class_32_4_a8fd484c *paVar5;
  atomic<unsigned_long> *paVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  double dVar9;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *pBVar10;
  char cVar11;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  *p_Var12;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  this_00;
  void *pvVar13;
  task *ptVar14;
  void *pvVar15;
  runtime_error *this_01;
  ulong uVar16;
  unsigned_long *puVar17;
  long lVar18;
  _func_int **pp_Var19;
  _func_int **N;
  BuildRecord *children_00;
  size_t i_1;
  _func_int **pp_Var20;
  bool bVar21;
  float fVar24;
  float fVar25;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  void *values [16];
  Split split_1;
  Split split;
  PrimInfoExtRange rprims;
  PrimInfoExtRange lprims;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  auto_partitioner local_a61;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *local_a60;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *local_a58;
  small_object_pool *local_a50;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *local_a48;
  BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:317:9),_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_void_*,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:291:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:296:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:306:9),_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:312:9)>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:322:9)>
  *local_a40;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *local_a38;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_a30;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_9b0;
  undefined1 local_940 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_930;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_920;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_910;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_900;
  unsigned_long local_8f0;
  unsigned_long uStack_8e8;
  unsigned_long local_8e0;
  Split local_8c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_840 [3];
  undefined8 local_810;
  undefined8 uStack_808;
  unsigned_long local_800;
  unsigned_long uStack_7f8;
  unsigned_long local_7f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_7e0;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  unsigned_long local_7a0;
  unsigned_long uStack_798;
  unsigned_long local_790;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_780 [16];
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    pBVar4 = *this->createAlloc->bvh;
    local_a60 = current;
    p_Var12 = (__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
               *)__tls_get_addr(&PTR_021f8d38);
    this_00._M_t.
    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
         p_Var12->_M_t;
    if ((_Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         )this_00._M_t.
          super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
          .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl ==
        (ThreadLocal2 *)0x0) {
      this_00._M_t.
      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
           (tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            )FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys((MutexSys *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl);
      (((atomic<embree::FastAllocator_*> *)
       ((long)this_00._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8)
       )->_M_b)._M_p = (__pointer_type)0x0;
      ((ThreadLocal *)
      ((long)this_00._M_t.
             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
      0x40))->parent =
           (ThreadLocal2 *)
           this_00._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x48) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x50) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x58) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x60) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x68) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x70) = (void *)0x0;
      ((ThreadLocal *)
      ((long)this_00._M_t.
             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
      0x80))->parent =
           (ThreadLocal2 *)
           this_00._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x88) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x90) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x98) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa8) = (void *)0x0;
      *(void **)((long)this_00._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xb0) = (void *)0x0;
      p_Var12->_M_t =
           this_00._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      local_780[0].depth = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      local_780[0].alloc_barrier = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_940._0_8_ =
           this_00._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)local_940);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)local_940);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_780);
    }
    alloc.talloc0 =
         (ThreadLocal *)
         ((long)this_00._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x40);
    alloc.talloc1 =
         (ThreadLocal *)
         ((long)this_00._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x80);
    if ((pBVar4->allocator).use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
    alloc.alloc = &pBVar4->allocator;
    current = local_a60;
  }
  if (((toplevel) &&
      (uVar16 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end
                - (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>.
                  _begin, uVar16 <= (this->cfg).singleThreadThreshold)) &&
     (paVar5 = this->progressMonitor, *paVar5->buildProgress != (RTCProgressMonitorFunction)0x0)) {
    paVar6 = paVar5->progress;
    LOCK();
    _Var1 = (paVar6->super___atomic_base<unsigned_long>)._M_i;
    (paVar6->super___atomic_base<unsigned_long>)._M_i =
         (paVar6->super___atomic_base<unsigned_long>)._M_i + uVar16;
    UNLOCK();
    lVar18 = _Var1 + uVar16;
    auVar22._8_4_ = (int)((ulong)lVar18 >> 0x20);
    auVar22._0_8_ = lVar18;
    auVar22._12_4_ = 0x45300000;
    sVar2 = *paVar5->primitiveCount;
    auVar23._8_4_ = (int)(sVar2 >> 0x20);
    auVar23._0_8_ = sVar2;
    auVar23._12_4_ = 0x45300000;
    dVar9 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0)) /
            ((auVar23._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
    if (1.0 <= dVar9) {
      dVar9 = 1.0;
    }
    (**paVar5->buildProgress)(*paVar5->userPtr,dVar9);
  }
  set = &current->prims;
  HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
  ::find(&local_8c0,this->heuristic,set,(this->cfg).logBlockSize);
  bVar3 = (byte)(this->cfg).logBlockSize;
  uVar7 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  uVar8 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin;
  uVar16 = uVar7 - uVar8;
  if (((uVar16 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) ||
     ((uVar16 <= (this->cfg).maxLeafSize &&
      (fVar24 = (current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[1] -
                (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[1],
      fVar25 = (current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[2] -
               (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[2],
      fVar25 = (fVar24 + fVar25) *
               ((current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[0] -
               (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[0]) +
               fVar25 * fVar24, fVar24 = (this->cfg).intCost,
      (float)((~(-1L << (bVar3 & 0x3f)) + uVar7) - uVar8 >> (bVar3 & 0x3f)) * fVar25 * fVar24 <=
      fVar25 * (this->cfg).travCost + fVar24 * local_8c0.sah)))) {
    HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
    ::deterministic_order(this->heuristic,set);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    pvVar13 = createLargeLeaf(this,current,alloc_00);
  }
  else {
    HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
    ::split(this->heuristic,&local_8c0,set,(PrimInfoExtRange *)&local_7e0.field_1,
            (PrimInfoExtRange *)&local_840[0].field_1);
    local_940._0_8_ = current->depth + 1;
    local_940[8] = false;
    local_930._0_8_ = local_7e0._0_8_;
    local_930._8_8_ = local_7e0._8_8_;
    local_920._0_8_ = local_7d0;
    local_920._8_8_ = uStack_7c8;
    local_910._0_8_ = local_7c0;
    local_910._8_8_ = uStack_7b8;
    local_900._0_8_ = local_7b0;
    local_900._8_8_ = uStack_7a8;
    local_8f0 = local_7a0;
    uStack_8e8 = uStack_798;
    local_8e0 = local_790;
    BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
    ::operator=(local_780,
                (BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
                 *)local_940);
    local_940._0_8_ = current->depth + 1;
    local_940[8] = false;
    local_930._0_8_ = local_840[0]._0_8_;
    local_930._8_8_ = local_840[0]._8_8_;
    local_900._0_8_ = local_810;
    local_900._8_8_ = uStack_808;
    local_8f0 = local_800;
    uStack_8e8 = uStack_7f8;
    local_8e0 = local_7f0;
    local_a60 = current;
    BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
    ::operator=(local_780 + 1,
                (BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
                 *)local_940);
    for (N = (_func_int **)0x2; pBVar10 = local_a60, N < (_func_int **)(this->cfg).branchingFactor;
        N = (_func_int **)((long)N + 1)) {
      puVar17 = &local_780[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _end;
      fVar24 = -INFINITY;
      pp_Var20 = (_func_int **)0xffffffffffffffff;
      for (pp_Var19 = (_func_int **)0x0; N != pp_Var19;
          pp_Var19 = (_func_int **)((long)pp_Var19 + 1)) {
        if (((this->cfg).minLeafSize < *puVar17 - ((range<unsigned_long> *)(puVar17 + -1))->_begin)
           && (fVar25 = *(float *)((long)puVar17 + -0x34) - *(float *)((long)puVar17 + -0x44),
              fVar25 = (fVar25 + (*(float *)(puVar17 + -6) - *(float *)(puVar17 + -8))) *
                       (*(float *)(puVar17 + -7) - *(float *)(puVar17 + -9)) +
                       (*(float *)(puVar17 + -6) - *(float *)(puVar17 + -8)) * fVar25,
              fVar24 < fVar25)) {
          pp_Var20 = pp_Var19;
          fVar24 = fVar25;
        }
        puVar17 = puVar17 + 0xe;
      }
      if (pp_Var20 == (_func_int **)0xffffffffffffffff) break;
      local_a58 = local_780 + (long)pp_Var20;
      local_a30.depth = local_a60->depth + 1;
      local_a30.alloc_barrier = false;
      local_a30.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
      local_a30.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
      local_a30.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[0] = -INFINITY;
      local_a30.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[1] = -INFINITY;
      local_a30.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[2] = -INFINITY;
      local_a30.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[3] = -INFINITY;
      local_a30.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
      local_a30.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
      local_a30.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[0] = -INFINITY;
      local_a30.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[1] = -INFINITY;
      local_a30.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[2] = -INFINITY;
      local_a30.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[3] = -INFINITY;
      local_a30.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin._0_4_ =
           0;
      local_a30.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin._4_4_ =
           0;
      local_a30.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end._0_4_ = 0;
      local_a30.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end._4_4_ = 0;
      local_a30.prims.super_extended_range<unsigned_long>._ext_end = 0;
      local_9b0._8_4_ = local_9b0._8_4_ & 0xffffff00;
      local_9b0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
      local_9b0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
      local_9b0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[0] = -INFINITY;
      local_9b0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[1] = -INFINITY;
      local_9b0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[2] = -INFINITY;
      local_9b0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[3] = -INFINITY;
      local_9b0.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
      local_9b0.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
      local_9b0.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[0] = -INFINITY;
      local_9b0.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[1] = -INFINITY;
      local_9b0.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[2] = -INFINITY;
      local_9b0.prims.super_CentGeomBBox3fa.centBounds.upper.field_0.m128[3] = -INFINITY;
      local_9b0.prims.super_extended_range<unsigned_long>._ext_end = 0;
      local_9b0.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin._0_4_ =
           0;
      local_9b0.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin._4_4_ =
           0;
      local_9b0.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end._0_4_ = 0;
      local_9b0.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end._4_4_ = 0;
      local_9b0.depth = local_a30.depth;
      HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
      ::find((Split *)local_940,this->heuristic,&local_780[(long)pp_Var20].prims,
             (this->cfg).logBlockSize);
      HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
      ::split(this->heuristic,(Split *)local_940,&local_780[(long)pp_Var20].prims,&local_a30.prims,
              &local_9b0.prims);
      BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
      ::operator=(local_a58,&local_a30);
      BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
      ::operator=(local_780 + (long)N,&local_9b0);
    }
    uVar16 = (this->cfg).primrefarrayalloc;
    if (uVar16 < (local_a60->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _end - (local_a60->prims).super_extended_range<unsigned_long>.
                        super_range<unsigned_long>._begin) {
      puVar17 = &local_780[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _end;
      pp_Var20 = N;
      while (bVar21 = pp_Var20 != (_func_int **)0x0, pp_Var20 = (_func_int **)((long)pp_Var20 + -1),
            bVar21) {
        *(bool *)(puVar17 + -10) =
             *puVar17 - ((range<unsigned_long> *)(puVar17 + -1))->_begin <= uVar16;
        puVar17 = puVar17 + 0xe;
      }
    }
    children_00 = local_780;
    std::
    __sort<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>>>>
              (children_00,local_780 + (long)N);
    pvVar13 = rtcBuildBVHSpatialSAH::anon_class_24_3_07848ca9::operator()
                        (this->createNode,children_00,(size_t)N,&alloc);
    if ((this->cfg).singleThreadThreshold <
        (pBVar10->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
        (pBVar10->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
      local_a48 = &local_a30;
      local_a38 = local_780;
      local_a40 = this;
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)local_940,(context_traits)0x4,CUSTOM_CTX);
      local_a50 = (small_object_pool *)0x0;
      ptVar14 = (task *)tbb::detail::r1::allocate(&local_a50,0x80);
      ptVar14->m_reserved[3] = 0;
      ptVar14->m_reserved[4] = 0;
      ptVar14->m_reserved[1] = 0;
      ptVar14->m_reserved[2] = 0;
      ptVar14->m_reserved[5] = 0;
      (ptVar14->super_task_traits).m_version_and_traits = 0;
      ptVar14->m_reserved[0] = 0;
      ptVar14->_vptr_task = (_func_int **)&PTR__task_021d4518;
      ptVar14[1]._vptr_task = N;
      ptVar14[1].super_task_traits.m_version_and_traits = 0;
      ptVar14[1].m_reserved[0] = 1;
      ptVar14[1].m_reserved[1] = (uint64_t)&local_a48;
      tbb::detail::d1::auto_partition_type::auto_partition_type
                ((auto_partition_type *)(ptVar14[1].m_reserved + 3),&local_a61);
      ptVar14[1].m_reserved[5] = (uint64_t)local_a50;
      local_9b0.depth = 0;
      local_9b0._8_4_ = 1;
      local_9b0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = 1;
      local_9b0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ = 1;
      ptVar14[1].m_reserved[2] = (uint64_t)&local_9b0;
      tbb::detail::r1::execute_and_wait
                (ptVar14,(task_group_context *)local_940,(wait_context *)&local_9b0.prims,
                 (task_group_context *)local_940);
      cVar11 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_940);
      if (cVar11 != '\0') {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"task cancelled");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)local_940);
    }
    else {
      for (pp_Var20 = (_func_int **)0x0; N != pp_Var20;
          pp_Var20 = (_func_int **)((long)pp_Var20 + 1)) {
        alloc_01.talloc0 = alloc.talloc0;
        alloc_01.alloc = alloc.alloc;
        alloc_01.talloc1 = alloc.talloc1;
        pvVar15 = recurse(this,children_00,alloc_01,false);
        (&local_a30.depth)[(long)pp_Var20] = (size_t)pvVar15;
        children_00 = children_00 + 1;
      }
    }
    (**this->updateNode->setNodeChildren)
              (pvVar13,(void **)&local_a30,(uint)N,*this->updateNode->userPtr);
  }
  return pvVar13;
}

Assistant:

const ReductionTy recurse(BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            auto split = heuristic.find(current.prims,cfg.logBlockSize);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*halfArea(current.prims.geomBounds)+cfg.intCost*split.splitSAH();
            assert((current.prims.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.prims.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.prims.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              heuristic.deterministic_order(current.prims);
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            Set lprims,rprims;
            heuristic.split(split,current.prims,lprims,rprims);
	    
            /*! initialize child list with initial split */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            children[0] = BuildRecord(current.depth+1,lprims);
            children[1] = BuildRecord(current.depth+1,rprims);
            size_t numChildren = 2;

            /*! split until node is full or SAH tells us to stop */
            while (numChildren < cfg.branchingFactor)
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.minLeafSize) continue;

                /* find child with largest surface area */
                if (halfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i;
                  bestArea = halfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              auto split = heuristic.find(brecord.prims,cfg.logBlockSize);
              heuristic.split(split,brecord.prims,lrecord.prims,rrecord.prims);
              children[bestChild  ] = lrecord;
              children[numChildren] = rrecord;
              numChildren++;
            }

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* sort buildrecords for faster shadow ray traversal */
            std::sort(&children[0],&children[numChildren],std::greater<BuildRecord>());

            /*! create an inner node */
            auto node = createNode(children,numChildren,alloc);

            /* spawn tasks */
            if (current.size() > cfg.singleThreadThreshold)
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) { // FIXME: no range here
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              return updateNode(current,children,node,values,numChildren);
            }
            /* recurse into each child */
            else
            {
              for (size_t i=0; i<numChildren; i++)
                values[i] = recurse(children[i],alloc,false);

              return updateNode(current,children,node,values,numChildren);
            }
          }